

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O2

void __thiscall MockUserCreateForm::clean(MockUserCreateForm *this)

{
  bool bVar1;
  char *__lhs;
  _Base_ptr p_Var2;
  allocator local_51;
  string local_50;
  
  if ((this->firstName)._M_string_length - 0x21 < 0xffffffffffffffe0) {
    std::__cxx11::string::string((string *)&local_50,"invalid first name length",&local_51);
    Form::addError((Form *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->lastName)._M_string_length - 0x41 < 0xffffffffffffffc0) {
    std::__cxx11::string::string((string *)&local_50,"invalid last name length",&local_51);
    Form::addError((Form *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->email)._M_string_length - 0x41 < 0xffffffffffffffc0) {
    std::__cxx11::string::string((string *)&local_50,"invalid first name length",&local_51);
    Form::addError((Form *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (p_Var2 = Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &Model<BaseUser>::objectList._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    __lhs = BaseUser::getEmail((BaseUser *)&p_Var2[1]._M_parent);
    bVar1 = std::operator==(__lhs,&this->email);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_50,"A user with this email already exists",&local_51);
      Form::addError((Form *)this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->password)._M_string_length - 0x41 < 0xffffffffffffffc0) {
    std::__cxx11::string::string((string *)&local_50,"invalid password length",&local_51);
    Form::addError((Form *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void MockUserCreateForm::clean() {

    if (firstName.empty() || firstName.size() > 32) addError("invalid first name length");
    if (lastName.empty() || lastName.size() > 64) addError("invalid last name length");
    if (email.empty() || email.size() > 64) addError("invalid first name length");
    for (auto &it : BaseUser::all()) {
        if (it.second.getEmail() == email) addError("A user with this email already exists");
    }
    if (password.empty() || password.size() > 64) addError("invalid password length");
}